

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O2

void RigidBodyDynamics::ForwardDynamicsConstraintsDirect
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,ConstraintSet *CS,
               VectorNd *QDDot,bool update_kinematics,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  uint uVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ConstraintSet *lambda;
  void *local_58 [2];
  VectorNd *local_48;
  ConstraintSet *local_40;
  
  lambda = CS;
  CalcConstrainedSystemVariables(model,Q,QDot,Tau,CS,update_kinematics,f_ext);
  local_40 = CS + 0x178;
  local_48 = Tau;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_58,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_48);
  SolveConstrainedSystemDirect
            ((MatrixNd *)(CS + 0x160),(MatrixNd *)(CS + 0x198),(VectorNd *)local_58,
             (VectorNd *)(CS + 0x188),(VectorNd *)lambda,(MatrixNd *)(CS + 0x1b0),
             (VectorNd *)(CS + 0x1c8),(VectorNd *)(CS + 0x1d8),(LinearSolver *)CS);
  free(local_58[0]);
  uVar1 = model->dof_count;
  lVar2 = *(long *)(CS + 0x1d8);
  pdVar3 = (QDDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
    pdVar3[uVar7] = *(double *)(lVar2 + uVar7 * 8);
  }
  lVar2 = *(long *)(CS + 0x10);
  lVar4 = *(long *)(CS + 0x130);
  lVar5 = *(long *)(CS + 8);
  lVar6 = *(long *)(CS + 0x1d8);
  for (uVar8 = 0; (ulong)uVar8 < (ulong)(lVar2 - lVar5 >> 2); uVar8 = uVar8 + 1) {
    *(ulong *)(lVar4 + (ulong)uVar8 * 8) =
         *(ulong *)(lVar6 + (ulong)(uVar1 + uVar8) * 8) ^ 0x8000000000000000;
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsConstraintsDirect (
  Model &model,
  const VectorNd &Q,
  const VectorNd &QDot,
  const VectorNd &Tau,
  ConstraintSet &CS,
  VectorNd &QDDot,
  bool update_kinematics,
  std::vector<Math::SpatialVector> *f_ext
)
{
  LOG << "-------- " << __func__ << " --------" << std::endl;

  CalcConstrainedSystemVariables (model, Q, QDot, Tau, CS, update_kinematics, 
                                  f_ext);

  SolveConstrainedSystemDirect (CS.H, CS.G, Tau - CS.C, CS.gamma
                                , CS.force, CS.A, CS.b, CS.x, CS.linear_solver);

  // Copy back QDDot
  for (unsigned int i = 0; i < model.dof_count; i++) {
    QDDot[i] = CS.x[i];
  }

  // Copy back contact forces
  for (unsigned int i = 0; i < CS.size(); i++) {
    CS.force[i] = -CS.x[model.dof_count + i];
  }
}